

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs,CBS *cbs)

{
  ssl_session_st *psVar1;
  uchar *puVar2;
  Span<const_unsigned_char> in;
  bool bVar3;
  char cVar4;
  int iVar5;
  tls_extension *ptVar6;
  byte bVar7;
  uint uVar8;
  SSL *ssl;
  byte bVar9;
  size_t in_R8;
  undefined **ppuVar10;
  long lVar11;
  Span<const_unsigned_char> protocol;
  uint8_t alert;
  uint16_t type;
  SSL *local_68;
  uint ext_index;
  CBS extensions;
  CBS extension;
  
  ssl = hs->ssl;
  extensions.data = cbs->data;
  extensions.len = cbs->len;
  bVar3 = tls1_check_duplicate_extensions(&extensions);
  bVar9 = 0x32;
  if (bVar3) {
    uVar8 = 0;
    local_68 = ssl;
    while (extensions.len != 0) {
      iVar5 = CBS_get_u16(&extensions,&type);
      ssl = local_68;
      if ((iVar5 == 0) ||
         (iVar5 = CBS_get_u16_length_prefixed(&extensions,&extension), ssl = local_68, iVar5 == 0))
      goto LAB_00135caa;
      ptVar6 = tls_extension_find(&ext_index,type);
      ssl = local_68;
      if (ptVar6 == (tls_extension *)0x0) {
        iVar5 = 0x1022;
LAB_00135b83:
        ERR_put_error(0x10,0,0xde,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,iVar5);
        ERR_add_error_dataf("extension %u",(ulong)type);
        bVar9 = 0x6e;
        goto LAB_00135caa;
      }
      bVar7 = (byte)ext_index;
      if (((hs->extensions).sent >> (ext_index & 0x1f) & 1) == 0) {
        iVar5 = 0x102d;
        goto LAB_00135b83;
      }
      alert = '2';
      bVar3 = (*ptVar6->parse_serverhello)(hs,&alert,&extension);
      if (!bVar3) {
        ERR_put_error(0x10,0,0x95,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x1037);
        ERR_add_error_dataf("extension %u",(ulong)type);
        ssl = local_68;
        bVar9 = alert;
        goto LAB_00135caa;
      }
      uVar8 = uVar8 | 1 << (bVar7 & 0x1f);
    }
    ppuVar10 = &PTR_ext_sni_parse_serverhello_002ee1a0;
    for (lVar11 = 0; lVar11 != 0x1c; lVar11 = lVar11 + 1) {
      if ((uVar8 >> ((uint)lVar11 & 0x1f) & 1) == 0) {
        extension.data._0_1_ = 0x32;
        cVar4 = (*(code *)*ppuVar10)(hs,&extension,0);
        if (cVar4 == '\0') {
          ERR_put_error(0x10,0,0xa4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x1044);
          ERR_add_error_dataf("extension %u",(ulong)*(ushort *)(ppuVar10 + -2));
          ssl = local_68;
          bVar9 = (byte)extension.data;
          goto LAB_00135caa;
        }
      }
      ppuVar10 = ppuVar10 + 5;
    }
    psVar1 = (hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    if (psVar1 == (ssl_session_st *)0x0) {
      return true;
    }
    if ((psVar1->field_0x1b8 & 0x40) == 0) {
      return true;
    }
    ssl = hs->ssl;
    puVar2 = (uchar *)(ssl->s3->alpn_selected).size_;
    if (puVar2 == (uchar *)0x0) {
      ERR_put_error(0x10,0,0x134,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1070);
      ssl_send_alert(ssl,2,0x2f);
      return false;
    }
    extensions.data = (uint8_t *)0x0;
    extensions.len = 0;
    protocol.size_ = in_R8;
    protocol.data_ = puVar2;
    bVar3 = ssl_get_local_application_settings
                      ((bssl *)hs,(SSL_HANDSHAKE *)&extensions,
                       (Span<const_unsigned_char> *)(ssl->s3->alpn_selected).data_,protocol);
    if (bVar3) {
      in.size_ = extensions.len;
      in.data_ = extensions.data;
      bVar3 = Array<unsigned_char>::CopyFrom
                        (&((hs->new_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                          local_application_settings,in);
      if (bVar3) {
        return true;
      }
      uVar8 = 0x50;
    }
    else {
      ERR_put_error(0x10,0,0x103,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1079);
      uVar8 = 0x2f;
    }
  }
  else {
LAB_00135caa:
    uVar8 = (uint)bVar9;
  }
  ssl_send_alert(ssl,2,uVar8);
  return false;
}

Assistant:

bool ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs, const CBS *cbs) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_serverhello_tlsext(hs, cbs, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_serverhello_tlsext(hs)) {
    return false;
  }

  return true;
}